

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *lhs_expression,char *rhs_expression,string *lhs_value,
          string *rhs_value,bool ignoring_case)

{
  bool bVar1;
  Message *pMVar2;
  ulong uVar3;
  size_type sVar4;
  AssertionResult *other;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar5;
  AssertionResult local_b0;
  string local_a0;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs_lines;
  Message local_40;
  Message msg;
  bool ignoring_case_local;
  string *rhs_value_local;
  string *lhs_value_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  msg.ss_.ptr_._7_1_ = ignoring_case;
  lhs_value_local = (string *)rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  Message::Message(&local_40);
  Message::operator<<(&local_40,(char (*) [35])"Expected equality of these values:");
  pMVar2 = Message::operator<<(&local_40,(char (*) [4])"\n  ");
  Message::operator<<(pMVar2,&rhs_expression_local);
  bVar1 = std::operator!=(lhs_value,rhs_expression_local);
  if (bVar1) {
    pMVar2 = Message::operator<<(&local_40,(char (*) [16])"\n    Which is: ");
    Message::operator<<(pMVar2,lhs_value);
  }
  pMVar2 = Message::operator<<(&local_40,(char (*) [4])"\n  ");
  Message::operator<<(pMVar2,(char **)&lhs_value_local);
  bVar1 = std::operator!=(rhs_value,(char *)lhs_value_local);
  if (bVar1) {
    pMVar2 = Message::operator<<(&local_40,(char (*) [16])"\n    Which is: ");
    Message::operator<<(pMVar2,rhs_value);
  }
  if ((msg.ss_.ptr_._7_1_ & 1) != 0) {
    Message::operator<<(&local_40,(char (*) [15])"\nIgnoring case");
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    anon_unknown_91::SplitEscapedString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&rhs_lines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,lhs_value);
    anon_unknown_91::SplitEscapedString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_80,rhs_value);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&rhs_lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((1 < sVar4) ||
       (sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_80), 1 < sVar4)) {
      pMVar2 = Message::operator<<(&local_40,(char (*) [13])"\nWith diff:\n");
      edit_distance::CreateUnifiedDiff
                (&local_a0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&rhs_lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80,2);
      Message::operator<<(pMVar2,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&rhs_lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  AssertionFailure();
  other = AssertionResult::operator<<(&local_b0,&local_40);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  AssertionResult::~AssertionResult(&local_b0);
  Message::~Message(&local_40);
  AVar5.message_.ptr_ = extraout_RDX.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult EqFailure(const char* lhs_expression,
                          const char* rhs_expression,
                          const std::string& lhs_value,
                          const std::string& rhs_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Expected equality of these values:";
  msg << "\n  " << lhs_expression;
  if (lhs_value != lhs_expression) {
    msg << "\n    Which is: " << lhs_value;
  }
  msg << "\n  " << rhs_expression;
  if (rhs_value != rhs_expression) {
    msg << "\n    Which is: " << rhs_value;
  }

  if (ignoring_case) {
    msg << "\nIgnoring case";
  }

  if (!lhs_value.empty() && !rhs_value.empty()) {
    const std::vector<std::string> lhs_lines =
        SplitEscapedString(lhs_value);
    const std::vector<std::string> rhs_lines =
        SplitEscapedString(rhs_value);
    if (lhs_lines.size() > 1 || rhs_lines.size() > 1) {
      msg << "\nWith diff:\n"
          << edit_distance::CreateUnifiedDiff(lhs_lines, rhs_lines);
    }
  }

  return AssertionFailure() << msg;
}